

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock.cc
# Opt level: O0

void __thiscall absl::base_internal::SpinLock::SlowUnlock(SpinLock *this,uint32_t lock_value)

{
  SpinLock *local_28;
  int64_t local_20;
  int64_t wait_cycles;
  SpinLock *pSStack_10;
  uint32_t lock_value_local;
  SpinLock *this_local;
  
  wait_cycles._4_4_ = lock_value;
  pSStack_10 = this;
  SpinLockWake(&this->lockword_,false);
  if ((wait_cycles._4_4_ & 0xfffffff8) != 8) {
    local_20 = DecodeWaitCycles(wait_cycles._4_4_);
    local_28 = this;
    AtomicHook<void(*)(void_const*,long)>::operator()(submit_profile_data,&local_28,&local_20);
  }
  return;
}

Assistant:

void SpinLock::SlowUnlock(uint32_t lock_value) {
  base_internal::SpinLockWake(&lockword_,
                              false);  // wake waiter if necessary

  // If our acquisition was contended, collect contentionz profile info.  We
  // reserve a unitary wait time to represent that a waiter exists without our
  // own acquisition having been contended.
  if ((lock_value & kWaitTimeMask) != kSpinLockSleeper) {
    const int64_t wait_cycles = DecodeWaitCycles(lock_value);
    ABSL_TSAN_MUTEX_PRE_DIVERT(this, 0);
    submit_profile_data(this, wait_cycles);
    ABSL_TSAN_MUTEX_POST_DIVERT(this, 0);
  }
}